

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResultData *this)

{
  bool bVar1;
  string local_60;
  undefined1 local_30 [8];
  ReusableStringStream rss;
  AssertionResultData *this_local;
  
  rss.m_oss = (ostream *)this;
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty(&this->reconstructedExpression);
  if ((bVar1) && (bVar1 = LazyExpression::operator_cast_to_bool(&this->lazyExpression), bVar1)) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
    ReusableStringStream::operator<<((ReusableStringStream *)local_30,&this->lazyExpression);
    ReusableStringStream::str_abi_cxx11_(&local_60,(ReusableStringStream *)local_30);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=(&this->reconstructedExpression,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,&this->reconstructedExpression);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {
    if (reconstructedExpression.empty()) {
      if (lazyExpression) {
        ReusableStringStream rss;
        rss << lazyExpression;
        reconstructedExpression = rss.str();
      }
    }
    return reconstructedExpression;
  }